

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fill.hpp
# Opt level: O2

map<int,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>_>_>_>
* njoy::ENDFtk::file::
  Base<njoy::ENDFtk::file::Type<2>,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>_>
  ::fill(map<int,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>_>_>_>
         *__return_storage_ptr__,
        vector<std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>_>_>
        *sections)

{
  _Rb_tree_header *__x;
  pointer pvVar1;
  undefined8 *puVar2;
  pointer section;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>_>_>,_bool>
  pVar3;
  undefined4 uStack_68;
  int MT;
  map<int,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>_>_>_>
  map;
  
  __x = &map._M_t._M_impl.super__Rb_tree_header;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  section = (sections->
            super__Vector_base<std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (sections->
           super__Vector_base<std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &__x->_M_header;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &__x->_M_header;
  while( true ) {
    if (section == pvVar1) {
      std::_Rb_tree_header::_Rb_tree_header
                (&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header,__x);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>_>,_std::_Select1st<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>_>_>_>
      ::~_Rb_tree(&map._M_t);
      return __return_storage_ptr__;
    }
    MT = Type<2>::getSectionNumber(section);
    pVar3 = std::
            _Rb_tree<int,std::pair<int_const,std::variant<njoy::ENDFtk::section::Type<2,151>,njoy::ENDFtk::section::Type<2,152>>>,std::_Select1st<std::pair<int_const,std::variant<njoy::ENDFtk::section::Type<2,151>,njoy::ENDFtk::section::Type<2,152>>>>,std::less<int>,std::allocator<std::pair<int_const,std::variant<njoy::ENDFtk::section::Type<2,151>,njoy::ENDFtk::section::Type<2,152>>>>>
            ::
            _M_emplace_unique<int&,std::variant<njoy::ENDFtk::section::Type<2,151>,njoy::ENDFtk::section::Type<2,152>>>
                      ((_Rb_tree<int,std::pair<int_const,std::variant<njoy::ENDFtk::section::Type<2,151>,njoy::ENDFtk::section::Type<2,152>>>,std::_Select1st<std::pair<int_const,std::variant<njoy::ENDFtk::section::Type<2,151>,njoy::ENDFtk::section::Type<2,152>>>>,std::less<int>,std::allocator<std::pair<int_const,std::variant<njoy::ENDFtk::section::Type<2,151>,njoy::ENDFtk::section::Type<2,152>>>>>
                        *)&map,&MT,section);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
    section = section + 1;
  }
  tools::Log::error<char_const*>((char *)CONCAT44(MT,uStack_68));
  tools::Log::info<char_const*>((char *)CONCAT44(MT,uStack_68));
  tools::Log::info<char_const*,int>("Encountered duplicate MT: {}",MT);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = getenv;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static auto
fill( std::vector< Section >&& sections ) {

  std::map< int, Section > map;
  for ( auto&& section : sections ) {

    int MT = Derived::getSectionNumber( section );
    if ( not map.emplace( MT, std::move( section ) ).second ) {

      Log::error( "Section with duplicate section number found" );
      Log::info( "Sections are required to specify a unique MT or section number" );
      Log::info( "Encountered duplicate MT: {}", MT );
      throw std::exception();
    }
  }
  return map;
}